

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::anon_unknown_1::CheckTypeIndex
                 (Location *loc,Type actual,Type expected,char *desc,Index index,char *index_kind,
                 Errors *errors)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  char *__args_1;
  Enum EVar4;
  Enum EVar5;
  char *pcVar6;
  char *pcVar7;
  string local_60;
  ErrorLevel local_3c;
  char *local_38;
  char *index_kind_local;
  char *pcStack_28;
  Index index_local;
  char *desc_local;
  Location *loc_local;
  Type local_10;
  Type expected_local;
  Type actual_local;
  
  local_38 = index_kind;
  index_kind_local._4_4_ = index;
  pcStack_28 = desc;
  desc_local = (char *)loc;
  loc_local._4_4_ = expected.enum_;
  local_10.enum_ = actual.enum_;
  EVar4 = Type::operator_cast_to_Enum(&local_10);
  EVar5 = Type::operator_cast_to_Enum((Type *)((long)&loc_local + 4));
  __args_1 = desc_local;
  pcVar3 = pcStack_28;
  uVar2 = index_kind_local._4_4_;
  pcVar1 = local_38;
  if (EVar4 == EVar5) {
    Result::Result((Result *)&expected_local,Ok);
  }
  else {
    local_3c = Error;
    pcVar6 = Type::GetName(&local_10);
    pcVar7 = Type::GetName((Type *)((long)&loc_local + 4));
    StringPrintf_abi_cxx11_
              (&local_60,"type mismatch for %s %u of %s. got %s, expected %s",pcVar1,(ulong)uVar2,
               pcVar3,pcVar6,pcVar7);
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)errors,&local_3c,
               (Location *)__args_1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result((Result *)&expected_local,Error);
  }
  return (Result)expected_local.enum_;
}

Assistant:

Result CheckTypeIndex(const Location& loc,
                      Type actual,
                      Type expected,
                      const char* desc,
                      Index index,
                      const char* index_kind,
                      Errors* errors) {
  // Types must match exactly; no subtyping should be allowed.
  if (actual != expected) {
    errors->emplace_back(ErrorLevel::Error, loc,
                         StringPrintf("type mismatch for %s %" PRIindex
                                      " of %s. got %s, expected %s",
                                      index_kind, index, desc, actual.GetName(),
                                      expected.GetName()));
    return Result::Error;
  }
  return Result::Ok;
}